

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Merge(MergeForm1 Merge)

{
  undefined1 uVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint32_t width;
  reference image;
  reference pvVar5;
  reference pvVar6;
  code *in_RDI;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  undefined2 in_stack_ffffffffffffff44;
  uint8_t in_stack_ffffffffffffff46;
  byte bVar7;
  uint8_t in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  ImageTemplate<unsigned_char> local_98 [2];
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  Image *in_stack_ffffffffffffffe0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe8;
  
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46
            );
  Test_Helper::uniformImages(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1db980);
  this = &local_38;
  image = std::
          vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ::operator[](this,0);
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,2);
  (*in_RDI)(local_98,image,pvVar5,pvVar6);
  uVar1 = Unit_Test::verifyImage
                    (image,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                     (bool)in_stack_ffffffffffffff47);
  bVar7 = false;
  if ((bool)uVar1) {
    pvVar5 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](&local_38,0);
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar5);
    pvVar5 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](&local_38,0);
    width = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar5);
    bVar2 = Unit_Test::equalSize
                      ((Image *)CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff44,
                                                                       uVar4))),width,
                       in_stack_ffffffffffffff38);
    bVar7 = false;
    if (bVar2) {
      uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_98);
      bVar7 = uVar3 == '\x03';
    }
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dbaae);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)image);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return (bool)(bVar7 & 1);
}

Assistant:

bool form1_Merge(MergeForm1 Merge)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const PenguinV_Image::Image output = Merge( input[0], input[1], input[2] );

        return verifyImage( output, intensity, false ) && equalSize( output, input[0].width(), input[0].height() ) && (output.colorCount() == PenguinV_Image::RGB);
    }